

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestUpdateCommand.h
# Opt level: O0

void __thiscall cmCTestUpdateCommand::~cmCTestUpdateCommand(cmCTestUpdateCommand *this)

{
  cmCTestUpdateCommand *this_local;
  
  cmCTestHandlerCommand::~cmCTestHandlerCommand(&this->super_cmCTestHandlerCommand);
  return;
}

Assistant:

cmCTestUpdateCommand() {}